

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 15-extract-template-function.cpp
# Opt level: O2

void fun<int>(env *lest_env,int *a,int *b)

{
  ostream *os;
  failure *this;
  allocator local_252;
  allocator local_251;
  result score;
  text local_1c0;
  text local_1a0;
  text local_180;
  string local_160 [32];
  location local_140;
  location local_118;
  text local_f0;
  text local_d0;
  string local_b0 [32];
  message local_90;
  
  local_90._0_8_ = a;
  lest::expression_lhs<int_const&>::operator==(&score,(expression_lhs<int_const&> *)&local_90,b);
  if (score.passed != false) {
    if ((lest_env->opt).pass == true) {
      os = lest_env->os;
      std::__cxx11::string::string
                (local_160,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/example/15-extract-template-function.cpp"
                 ,&local_252);
      std::__cxx11::string::string((string *)&local_140,local_160);
      local_140.line = 0xc;
      std::__cxx11::string::string((string *)&local_180,"a == b",&local_251);
      std::__cxx11::string::string((string *)&local_1a0,(string *)&score.decomposition);
      lest::passing::passing
                ((passing *)&local_90,&local_140,&local_180,&local_1a0,(lest_env->opt).zen);
      lest::env::context_abi_cxx11_(&local_1c0,lest_env);
      lest::report(os,&local_90,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      lest::message::~message(&local_90);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string(local_160);
    }
    std::__cxx11::string::~string((string *)&score.decomposition);
    return;
  }
  this = (failure *)__cxa_allocate_exception(0x78);
  std::__cxx11::string::string
            (local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/example/15-extract-template-function.cpp"
             ,(allocator *)&local_90);
  std::__cxx11::string::string((string *)&local_118,local_b0);
  local_118.line = 0xc;
  std::__cxx11::string::string((string *)&local_d0,"a == b",&local_252);
  std::__cxx11::string::string((string *)&local_f0,(string *)&score.decomposition);
  lest::failure::failure(this,&local_118,&local_d0,&local_f0);
  __cxa_throw(this,&lest::failure::typeinfo,lest::message::~message);
}

Assistant:

void fun( lest::env & lest_env, T const & a, T const & b )
{
    EXPECT( a == b );
}